

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

int __thiscall QMetaEnumBuilder::addKey(QMetaEnumBuilder *this,QByteArray *name,quint64 value)

{
  int iVar1;
  QMetaEnumBuilderPrivate *this_00;
  QMetaEnumBuilderPrivate *pQVar2;
  
  this_00 = d_func(this);
  if (this_00 != (QMetaEnumBuilderPrivate *)0x0) {
    pQVar2 = d_func(this);
    if (pQVar2 != (QMetaEnumBuilderPrivate *)0x0) {
      *(byte *)&(pQVar2->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
                super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (byte)(pQVar2->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
                 super_QFlagsStorage<QtMocConstants::EnumFlags>.i | 0x40;
    }
    iVar1 = QMetaEnumBuilderPrivate::addKey(this_00,name,value);
    return iVar1;
  }
  return -1;
}

Assistant:

int QMetaEnumBuilder::addKey(const QByteArray &name, quint64 value)
{
    QMetaEnumBuilderPrivate *d = d_func();
    if (d) {
        setIs64Bit(true);
        return d->addKey(name, value);
    }
    return -1;
}